

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::BindingSamplersTest::prepareUniforms
          (BindingSamplersTest *this,program *program)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  socklen_t sVar4;
  TEXTURE_TYPES in_EDX;
  TEXTURE_TYPES texture_type;
  TEXTURE_TYPES texture_type_00;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  long lVar3;
  
  prepareTexture(this,&this->m_goku_texture,in_EDX,0xff);
  prepareTexture(this,&this->m_vegeta_texture,texture_type,0xff00);
  prepareTexture(this,&this->m_trunks_texture,texture_type_00,0xff0000);
  iVar1 = (*((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 8))(0x84c0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  iVar1 = 0x1ab5f16;
  sVar4 = 0x27b9;
  glu::checkError(dVar2,"ActiveTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x27b9);
  Utils::texture::bind(&this->m_goku_texture,iVar1,__addr,sVar4);
  (**(code **)(lVar3 + 8))(0x84c1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  iVar1 = 0x1ab5f16;
  sVar4 = 0x27be;
  glu::checkError(dVar2,"ActiveTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x27be);
  Utils::texture::bind(&this->m_vegeta_texture,iVar1,__addr_00,sVar4);
  (**(code **)(lVar3 + 8))(0x84c3);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  iVar1 = 0x1ab5f16;
  sVar4 = 0x27c3;
  glu::checkError(dVar2,"ActiveTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x27c3);
  Utils::texture::bind(&this->m_trunks_texture,iVar1,__addr_01,sVar4);
  return;
}

Assistant:

void BindingSamplersTest::prepareUniforms(Utils::program& program)
{
	(void)program;
	static const GLuint goku_data   = 0x000000ff;
	static const GLuint vegeta_data = 0x0000ff00;
	static const GLuint trunks_data = 0x00ff0000;

	prepareTexture(m_goku_texture, m_test_case, goku_data);
	prepareTexture(m_vegeta_texture, m_test_case, vegeta_data);
	prepareTexture(m_trunks_texture, m_test_case, trunks_data);

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

	m_goku_texture.bind();

	gl.activeTexture(GL_TEXTURE1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

	m_vegeta_texture.bind();

	gl.activeTexture(GL_TEXTURE3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

	m_trunks_texture.bind();
}